

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

vec3_t tri3_get_point_barycentric_coordinates(vec3_t v0,vec3_t v1,vec3_t v2,vec3_t p)

{
  mat3_t m_00;
  mat3_t m_01;
  vec3_t vVar1;
  undefined8 in_stack_fffffffffffffebc;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined1 auStack_c0 [8];
  mat3_t m;
  float local_90;
  undefined8 local_88;
  vec3_t p_local;
  float local_68;
  float fStack_64;
  vec3_t v2_local;
  float local_48;
  float fStack_44;
  vec3_t v1_local;
  float local_28;
  float fStack_24;
  vec3_t v0_local;
  
  local_90 = p.z;
  register0x00001380 = p._0_8_;
  register0x00001300 = v2._0_8_;
  local_28 = v0.x;
  fStack_24 = v0.y;
  local_48 = v1.x;
  fStack_44 = v1.y;
  local_68 = v2.x;
  fStack_64 = v2.y;
  local_88 = register0x00001380;
  p_local.x = local_90;
  mat3((mat3_t *)auStack_c0,local_28,fStack_24,v0.z,local_48,fStack_44,v1.z,local_68,fStack_64,v2.z)
  ;
  m_01._8_8_ = m._8_8_;
  m_01._0_8_ = m._0_8_;
  m_01._16_8_ = m._16_8_;
  m_01.m[2][0] = m.m[2][0];
  m_01._28_8_ = in_stack_fffffffffffffebc;
  mat3_inverse(m_01);
  vVar1 = vec3((float)local_88,local_88._4_4_,p_local.x);
  m_00._8_8_ = uStack_e0;
  m_00._0_8_ = local_e8;
  m_00._16_8_ = local_d8;
  m_00._24_8_ = uStack_d0;
  m_00.m[2][2] = (float)local_c8;
  vVar1 = mat3_mul_vec3(m_00,vVar1);
  return vVar1;
}

Assistant:

vec3_t
tri3_get_point_barycentric_coordinates(vec3_t v0, vec3_t v1, vec3_t v2, vec3_t p) {
    mat3_t  m   = mat3(v0.x, v0.y, v0.z,
                       v1.x, v1.y, v1.z,
                       v2.x, v2.y, v2.z);
    return mat3_mul_vec3(mat3_inverse(m), vec3(p.x, p.y, p.z));
}